

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex9.cpp
# Opt level: O0

void func_free(void)

{
  ostream *poVar1;
  undefined4 *local_20;
  int *three;
  int *two;
  int *one;
  
  two = (int *)operator_new(4);
  *two = 100;
  three = (int *)operator_new(4);
  *three = 200;
  local_20 = (undefined4 *)operator_new(4);
  *local_20 = 300;
  poVar1 = std::operator<<((ostream *)&std::cout,"\nMemory addresses on heap:");
  poVar1 = std::operator<<(poVar1,"\n&one=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,&two);
  poVar1 = std::operator<<(poVar1,"\n&two=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,&three);
  poVar1 = std::operator<<(poVar1,"\n&three=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,&local_20);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (two != (int *)0x0) {
    operator_delete(two,4);
  }
  if (three != (int *)0x0) {
    operator_delete(three,4);
  }
  if (local_20 != (undefined4 *)0x0) {
    operator_delete(local_20,4);
  }
  return;
}

Assistant:

void func_free()
{
	int* one = new int;
	*one = 100;
	int* two = new int;
	*two = 200;
	int* three = new int;
	*three = 300;

	std::cout << "\nMemory addresses on heap:"
		<< "\n&one=" << &one
		<< "\n&two=" << &two
		<< "\n&three=" << &three
		<< std::endl;

	delete one;
	delete two;
	delete three;
}